

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_avx512.c
# Opt level: O2

uint8_t * CHUNKCOPY(uint8_t *out,uint8_t *from,uint len)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  byte bVar3;
  sbyte sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar12 [32];
  undefined1 auVar11 [32];
  
  uVar10 = len & 0x1f;
  if (len < 0x20) {
    sVar4 = ((byte)uVar10 < 0x21) * (' ' - (byte)uVar10);
    uVar8 = (uint)(-1 << sVar4) >> sVar4;
    auVar11 = vmovdqu8_avx512vl(*(undefined1 (*) [32])from);
    auVar12[1] = ((byte)(uVar8 >> 1) & 1) * auVar11[1];
    auVar12[0] = ((byte)uVar8 & 1) * auVar11[0];
    auVar12[2] = ((byte)(uVar8 >> 2) & 1) * auVar11[2];
    auVar12[3] = ((byte)(uVar8 >> 3) & 1) * auVar11[3];
    auVar12[4] = ((byte)(uVar8 >> 4) & 1) * auVar11[4];
    auVar12[5] = ((byte)(uVar8 >> 5) & 1) * auVar11[5];
    auVar12[6] = ((byte)(uVar8 >> 6) & 1) * auVar11[6];
    auVar12[7] = ((byte)(uVar8 >> 7) & 1) * auVar11[7];
    auVar12[8] = ((byte)(uVar8 >> 8) & 1) * auVar11[8];
    auVar12[9] = ((byte)(uVar8 >> 9) & 1) * auVar11[9];
    auVar12[10] = ((byte)(uVar8 >> 10) & 1) * auVar11[10];
    auVar12[0xb] = ((byte)(uVar8 >> 0xb) & 1) * auVar11[0xb];
    auVar12[0xc] = ((byte)(uVar8 >> 0xc) & 1) * auVar11[0xc];
    auVar12[0xd] = ((byte)(uVar8 >> 0xd) & 1) * auVar11[0xd];
    auVar12[0xe] = ((byte)(uVar8 >> 0xe) & 1) * auVar11[0xe];
    auVar12[0xf] = ((byte)(uVar8 >> 0xf) & 1) * auVar11[0xf];
    auVar12[0x10] = ((byte)(uVar8 >> 0x10) & 1) * auVar11[0x10];
    auVar12[0x11] = ((byte)(uVar8 >> 0x11) & 1) * auVar11[0x11];
    auVar12[0x12] = ((byte)(uVar8 >> 0x12) & 1) * auVar11[0x12];
    auVar12[0x13] = ((byte)(uVar8 >> 0x13) & 1) * auVar11[0x13];
    auVar12[0x14] = ((byte)(uVar8 >> 0x14) & 1) * auVar11[0x14];
    auVar12[0x15] = ((byte)(uVar8 >> 0x15) & 1) * auVar11[0x15];
    auVar12[0x16] = ((byte)(uVar8 >> 0x16) & 1) * auVar11[0x16];
    auVar12[0x17] = ((byte)(uVar8 >> 0x17) & 1) * auVar11[0x17];
    bVar3 = (byte)(uVar8 >> 0x18);
    auVar12[0x18] = (bVar3 & 1) * auVar11[0x18];
    auVar12[0x19] = (bVar3 >> 1 & 1) * auVar11[0x19];
    auVar12[0x1a] = (bVar3 >> 2 & 1) * auVar11[0x1a];
    auVar12[0x1b] = (bVar3 >> 3 & 1) * auVar11[0x1b];
    auVar12[0x1c] = (bVar3 >> 4 & 1) * auVar11[0x1c];
    auVar12._30_2_ = auVar11._30_2_;
    auVar12[0x1d] = (bVar3 >> 5 & 1) * auVar11[0x1d];
    auVar11 = vmovdqu8_avx512vl(auVar12);
    *(undefined1 (*) [32])out = auVar11;
    return out + uVar10;
  }
  uVar5 = *(undefined8 *)(from + 8);
  uVar6 = *(undefined8 *)(from + 0x10);
  uVar7 = *(undefined8 *)(from + 0x18);
  uVar9 = 0x20;
  if (uVar10 != 0) {
    uVar9 = (ulong)uVar10;
  }
  *(undefined8 *)out = *(undefined8 *)from;
  *(undefined8 *)(out + 8) = uVar5;
  *(undefined8 *)(out + 0x10) = uVar6;
  *(undefined8 *)(out + 0x18) = uVar7;
  for (; len != (uint)uVar9; uVar9 = uVar9 + 0x20) {
    puVar1 = from + uVar9;
    uVar5 = *(undefined8 *)(puVar1 + 8);
    uVar6 = *(undefined8 *)(puVar1 + 0x10);
    uVar7 = *(undefined8 *)(puVar1 + 0x18);
    puVar2 = out + uVar9;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 8) = uVar5;
    *(undefined8 *)(puVar2 + 0x10) = uVar6;
    *(undefined8 *)(puVar2 + 0x18) = uVar7;
  }
  return out + uVar9;
}

Assistant:

static inline uint8_t* CHUNKCOPY(uint8_t *out, uint8_t const *from, unsigned len) {
    Assert(len > 0, "chunkcopy should never have a length 0");

    chunk_t chunk;
    uint32_t rem = len % sizeof(chunk_t);

    if (len < sizeof(chunk_t)) {
        mask_t rem_mask = gen_mask(rem);
        chunk = _mm256_maskz_loadu_epi8(rem_mask, from);
        _mm256_mask_storeu_epi8(out, rem_mask, chunk);
        return out + rem;
    }

    loadchunk(from, &chunk);
    rem = (rem == 0) ? sizeof(chunk_t) : rem;
    storechunk(out, &chunk);
    out += rem;
    from += rem;
    len -= rem;

    while (len > 0) {
        loadchunk(from, &chunk);
        storechunk(out, &chunk);
        out += sizeof(chunk_t);
        from += sizeof(chunk_t);
        len -= sizeof(chunk_t);
    }

    return out;
}